

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InsertSort.c
# Opt level: O0

int main(void)

{
  uint local_38 [2];
  int sort [10];
  int i;
  
  sort[9] = 0;
  memcpy(local_38,&DAT_00102010,0x28);
  InsertSort((int *)local_38,10);
  for (sort[8] = 0; sort[8] < 10; sort[8] = sort[8] + 1) {
    printf("%d",(ulong)(uint)sort[(long)sort[8] + -2]);
  }
  return 0;
}

Assistant:

int main(){
    int i,sort[10] = {3,5,1,8,7,2,6,4,9,0};
    InsertSort(sort,10);
    for (i = 0; i < 10; ++i) {
        printf("%d",sort[i]);
    }
    return 0;
}